

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O1

void __thiscall nvim::Nvim::async_ui_pum_set_height(Nvim *this,Integer height)

{
  string local_48;
  Integer local_28;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_28 = height;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"nvim_ui_pum_set_height","");
  NvimRPC::async_call<long>(&this->client_,&local_48,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::async_ui_pum_set_height(Integer height) {
    client_.async_call("nvim_ui_pum_set_height", height);
}